

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gestures.h
# Opt level: O3

void UpdateGestures(void)

{
  uint uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  timespec now;
  timespec local_18;
  
  if ((GESTURES.current - 1 < 2) && (GESTURES.Touch.pointCount < 2)) {
    GESTURES.current = 4;
    clock_gettime(1,&local_18);
    lVar2 = local_18.tv_sec * 1000000000 + local_18.tv_nsec;
    auVar3._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar3._0_8_ = lVar2;
    auVar3._12_4_ = 0x45300000;
    GESTURES.Hold.timeDuration =
         ((auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 1000000.0;
  }
  clock_gettime(1,&local_18);
  lVar2 = local_18.tv_sec * 1000000000 + local_18.tv_nsec;
  auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar4._0_8_ = lVar2;
  auVar4._12_4_ = 0x45300000;
  if (((300.0 < ((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 1000000.0 -
                GESTURES.Touch.eventTime) && (GESTURES.current == 8)) &&
     (GESTURES.Touch.pointCount < 2)) {
    GESTURES.current = 4;
    clock_gettime(1,&local_18);
    local_18.tv_nsec = local_18.tv_sec * 1000000000 + local_18.tv_nsec;
    auVar5._8_4_ = (int)((ulong)local_18.tv_nsec >> 0x20);
    auVar5._0_8_ = local_18.tv_nsec;
    auVar5._12_4_ = 0x45300000;
    GESTURES.Hold.timeDuration =
         ((auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_18.tv_nsec) - 4503599627370496.0)) / 1000000.0;
    GESTURES.Hold.resetRequired = true;
  }
  uVar1 = GESTURES.current - 0x10 >> 4;
  if (((GESTURES.current << 0x1c | uVar1) < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    GESTURES.current = 0;
  }
  return;
}

Assistant:

void UpdateGestures(void)
{
    // NOTE: Gestures are processed through system callbacks on touch events

    // Detect GESTURE_HOLD
    if (((GESTURES.current == GESTURE_TAP) || (GESTURES.current == GESTURE_DOUBLETAP)) && (GESTURES.Touch.pointCount < 2))
    {
        GESTURES.current = GESTURE_HOLD;
        GESTURES.Hold.timeDuration = GetCurrentTime();
    }

    if (((GetCurrentTime() - GESTURES.Touch.eventTime) > TAP_TIMEOUT) && (GESTURES.current == GESTURE_DRAG) && (GESTURES.Touch.pointCount < 2))
    {
        GESTURES.current = GESTURE_HOLD;
        GESTURES.Hold.timeDuration = GetCurrentTime();
        GESTURES.Hold.resetRequired = true;
    }

    // Detect GESTURE_NONE
    if ((GESTURES.current == GESTURE_SWIPE_RIGHT) || (GESTURES.current == GESTURE_SWIPE_UP) || (GESTURES.current == GESTURE_SWIPE_LEFT) || (GESTURES.current == GESTURE_SWIPE_DOWN))
    {
        GESTURES.current = GESTURE_NONE;
    }
}